

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_pHYs(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  uint uVar1;
  
  uVar1 = 0x4a;
  if (chunkLength == 9) {
    info->phys_defined = 1;
    uVar1 = *(uint *)data;
    info->phys_x = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(data + 4);
    info->phys_y = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    info->phys_unit = (uint)data[8];
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_pHYs(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if (chunkLength != 9) return 74; /*invalid pHYs chunk size*/

  info->phys_defined = 1;
  info->phys_x = 16777216u * data[0] + 65536u * data[1] + 256u * data[2] + data[3];
  info->phys_y = 16777216u * data[4] + 65536u * data[5] + 256u * data[6] + data[7];
  info->phys_unit = data[8];

  return 0; /* OK */
}